

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_TwoLevelShm.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP5Writer::WriteData_TwoLevelShm(BP5Writer *this,BufferV *Data)

{
  Comm *this_00;
  Comm *this_01;
  uint64_t *buf;
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  unsigned_long *puVar5;
  uint64_t uVar6;
  size_t alignment_size;
  long lVar7;
  Comm *this_02;
  ulong blocksize;
  allocator local_c9;
  BufferV *local_c8;
  MPIShmChain *local_c0;
  uint64_t nextWriterPos;
  uint64_t nextWriterPos_3;
  Comm local_90;
  Comm local_88;
  uint64_t nextWriterPos_1;
  TokenChain<unsigned_long> tokenChain;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mySizes;
  
  local_c8 = Data;
  if (this->m_Aggregator == (MPIAggregator *)0x0) {
    local_c0 = (MPIShmChain *)0x0;
  }
  else {
    local_c0 = (MPIShmChain *)
               __dynamic_cast(this->m_Aggregator,&aggregator::MPIAggregator::typeinfo,
                              &aggregator::MPIShmChain::typeinfo);
  }
  buf = &this->m_DataPos;
  uVar4 = helper::PaddingToAlignOffset
                    (this->m_DataPos,(ulong)(this->super_BP5Engine).m_Parameters.StripeSize);
  this->m_DataPos = this->m_DataPos + uVar4;
  this_00 = &(local_c0->super_MPIAggregator).m_Comm;
  uVar4 = adios2::format::BufferV::Size(local_c8);
  blocksize = 0;
  helper::Comm::GatherValues<unsigned_long>(&mySizes,this_00,uVar4,0);
  lVar7 = 0;
  for (; mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
         mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
      mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    uVar1 = *mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = lVar7 + uVar1;
    if (blocksize < uVar1) {
      blocksize = uVar1;
    }
  }
  iVar2 = helper::Comm::Size(this_00);
  if (1 < iVar2) {
    alignment_size = 0x20;
    if ((this->super_BP5Engine).m_Parameters.DirectIO != false) {
      alignment_size = (ulong)(this->super_BP5Engine).m_Parameters.DirectIOAlignOffset;
    }
    aggregator::MPIShmChain::CreateShm
              (local_c0,blocksize,(this->super_BP5Engine).m_Parameters.MaxShmSize,alignment_size);
  }
  shm::TokenChain<unsigned_long>::TokenChain(&tokenChain,this_00);
  if ((local_c0->super_MPIAggregator).m_IsAggregator != true) {
    puVar5 = shm::TokenChain<unsigned_long>::RecvToken(&tokenChain);
    this->m_StartDataPos = *puVar5;
    SendDataToAggregator(this,local_c8);
    uVar4 = this->m_StartDataPos;
    uVar6 = adios2::format::BufferV::Size(local_c8);
    nextWriterPos_3 = uVar6 + uVar4;
    shm::TokenChain<unsigned_long>::SendToken(&tokenChain,&nextWriterPos_3);
    goto LAB_004cfbf2;
  }
  this_01 = &local_c0->m_AggregatorChainComm;
  iVar2 = helper::Comm::Rank(this_01);
  if (iVar2 < 1) {
    uVar4 = *buf;
  }
  else {
    iVar2 = helper::Comm::Rank(this_01);
    std::__cxx11::string::string
              ((string *)&nextWriterPos_3,
               "AggregatorChain token in BP5Writer::WriteData_TwoLevelShm",
               (allocator *)&nextWriterPos);
    helper::Comm::Recv<unsigned_long>
              ((Status *)&nextWriterPos_1,this_01,buf,1,iVar2 + -1,0,(string *)&nextWriterPos_3);
    std::__cxx11::string::~string((string *)&nextWriterPos_3);
    uVar4 = helper::PaddingToAlignOffset
                      (this->m_DataPos,(ulong)(this->super_BP5Engine).m_Parameters.StripeSize);
    uVar4 = uVar4 + *buf;
    *buf = uVar4;
  }
  this->m_StartDataPos = uVar4;
  iVar2 = helper::Comm::Rank(this_01);
  iVar3 = helper::Comm::Size(this_01);
  if (iVar2 < iVar3 + -1) {
    nextWriterPos_1 = *buf + lVar7;
    iVar2 = helper::Comm::Rank(this_01);
    std::__cxx11::string::string
              ((string *)&nextWriterPos_3,"Chain token in BP5Writer::WriteData",
               (allocator *)&nextWriterPos);
    helper::Comm::Isend<unsigned_long>
              (&local_88,(unsigned_long *)this_01,(size_t)&nextWriterPos_1,1,iVar2 + 1,(string *)0x0
              );
    this_02 = &local_88;
LAB_004cfb20:
    helper::Comm::Req::~Req((Req *)this_02);
    std::__cxx11::string::~string((string *)&nextWriterPos_3);
  }
  else {
    iVar2 = helper::Comm::Size(this_01);
    if (1 < iVar2) {
      nextWriterPos_1 = *buf + lVar7;
      std::__cxx11::string::string
                ((string *)&nextWriterPos_3,"Chain token in BP5Writer::WriteData",
                 (allocator *)&nextWriterPos);
      helper::Comm::Isend<unsigned_long>
                (&local_90,(unsigned_long *)this_01,(size_t)&nextWriterPos_1,1,0,(string *)0x0);
      this_02 = &local_90;
      goto LAB_004cfb20;
    }
  }
  uVar4 = *buf;
  uVar6 = adios2::format::BufferV::Size(local_c8);
  nextWriterPos = uVar6 + uVar4;
  shm::TokenChain<unsigned_long>::SendToken(&tokenChain,&nextWriterPos);
  WriteMyOwnData(this,local_c8);
  iVar2 = helper::Comm::Size(this_00);
  if (1 < iVar2) {
    uVar4 = adios2::format::BufferV::Size(local_c8);
    WriteOthersData(this,lVar7 - uVar4);
  }
  iVar2 = helper::Comm::Size(this_01);
  if (1 < iVar2) {
    iVar2 = helper::Comm::Rank(this_01);
    if (iVar2 == 0) {
      iVar2 = helper::Comm::Size(this_01);
      std::__cxx11::string::string
                ((string *)&nextWriterPos_3,"Chain token in BP5Writer::WriteData",&local_c9);
      helper::Comm::Recv<unsigned_long>
                ((Status *)&nextWriterPos_1,this_01,buf,1,iVar2 + -1,0,(string *)&nextWriterPos_3);
      std::__cxx11::string::~string((string *)&nextWriterPos_3);
    }
  }
LAB_004cfbf2:
  iVar2 = helper::Comm::Size(this_00);
  if (1 < iVar2) {
    aggregator::MPIShmChain::DestroyShm(local_c0);
  }
  shm::TokenChain<unsigned_long>::~TokenChain(&tokenChain);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void BP5Writer::WriteData_TwoLevelShm(format::BufferV *Data)
{
    aggregator::MPIShmChain *a = dynamic_cast<aggregator::MPIShmChain *>(m_Aggregator);

    // new step writing starts at offset m_DataPos on master aggregator
    // other aggregators to the same file will need to wait for the position
    // to arrive from the rank below

    // align to PAGE_SIZE (only valid on master aggregator at this point)
    m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);

    // Each aggregator needs to know the total size they write
    // This calculation is valid on aggregators only
    std::vector<uint64_t> mySizes = a->m_Comm.GatherValues(Data->Size());
    uint64_t myTotalSize = 0;
    uint64_t maxSize = 0;
    for (auto s : mySizes)
    {
        myTotalSize += s;
        if (s > maxSize)
        {
            maxSize = s;
        }
    }

    if (a->m_Comm.Size() > 1)
    {
        size_t alignment_size = sizeof(max_align_t);
        if (m_Parameters.DirectIO)
        {
            alignment_size = m_Parameters.DirectIOAlignOffset;
        }
        a->CreateShm(static_cast<size_t>(maxSize), m_Parameters.MaxShmSize, alignment_size);
    }

    shm::TokenChain<uint64_t> tokenChain(&a->m_Comm);

    if (a->m_IsAggregator)
    {
        // In each aggregator chain, send from master down the line
        // these total sizes, so every aggregator knows where to start
        if (a->m_AggregatorChainComm.Rank() > 0)
        {
            a->m_AggregatorChainComm.Recv(
                &m_DataPos, 1, a->m_AggregatorChainComm.Rank() - 1, 0,
                "AggregatorChain token in BP5Writer::WriteData_TwoLevelShm");
            // align to PAGE_SIZE
            m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);
        }
        m_StartDataPos = m_DataPos; // metadata needs this info
        if (a->m_AggregatorChainComm.Rank() < a->m_AggregatorChainComm.Size() - 1)
        {
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, a->m_AggregatorChainComm.Rank() + 1,
                                           0, "Chain token in BP5Writer::WriteData");
        }
        else if (a->m_AggregatorChainComm.Size() > 1)
        {
            // send back final position from last aggregator in file to master
            // aggregator
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, 0, 0,
                                           "Chain token in BP5Writer::WriteData");
        }

        /*std::cout << "Rank " << m_Comm.Rank()
                  << " aggregator start writing step " << m_WriterStep
                  << " to subfile " << a->m_SubStreamIndex << " at pos "
                  << m_DataPos << " totalsize " << myTotalSize << std::endl;*/

        // Send token to first non-aggregator to start filling shm
        // Also informs next process its starting offset (for correct metadata)
        uint64_t nextWriterPos = m_DataPos + Data->Size();
        tokenChain.SendToken(nextWriterPos);

        WriteMyOwnData(Data);

        /* Write from shm until every non-aggr sent all data */
        if (a->m_Comm.Size() > 1)
        {
            WriteOthersData(myTotalSize - Data->Size());
        }

        // Master aggregator needs to know where the last writing ended by the
        // last aggregator in the chain, so that it can start from the correct
        // position at the next output step
        if (a->m_AggregatorChainComm.Size() > 1 && !a->m_AggregatorChainComm.Rank())
        {
            a->m_AggregatorChainComm.Recv(&m_DataPos, 1, a->m_AggregatorChainComm.Size() - 1, 0,
                                          "Chain token in BP5Writer::WriteData");
        }
    }
    else
    {
        // non-aggregators fill shared buffer in marching order
        // they also receive their starting offset this way
        m_StartDataPos = tokenChain.RecvToken();

        /*std::cout << "Rank " << m_Comm.Rank()
                  << " non-aggregator recv token to fill shm = "
                  << m_StartDataPos << std::endl;*/

        SendDataToAggregator(Data);

        uint64_t nextWriterPos = m_StartDataPos + Data->Size();
        tokenChain.SendToken(nextWriterPos);
    }

    if (a->m_Comm.Size() > 1)
    {
        a->DestroyShm();
    }
}